

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pvip_string.c
# Opt level: O0

PVIP_BOOL PVIP_string_concat(PVIPString *str,char *src,size_t len)

{
  char *pcVar1;
  size_t len_local;
  char *src_local;
  PVIPString *str_local;
  
  if (str->buflen < str->len + len) {
    str->buflen = (str->len + len) * 2;
    pcVar1 = (char *)realloc(str->buf,str->buflen);
    str->buf = pcVar1;
    if (str->buf == (char *)0x0) {
      return 0;
    }
  }
  memcpy(str->buf + str->len,src,len);
  str->len = len + str->len;
  return 1;
}

Assistant:

PVIP_BOOL PVIP_string_concat(PVIPString *str, const char *src, size_t len) {
    if (str->len + len > str->buflen) {
        str->buflen = ( str->len + len ) * 2;
        str->buf    = realloc(str->buf, str->buflen);
        if (!str->buf) {
            return PVIP_FALSE;
        }
    }
    memcpy(str->buf + str->len, src, len);
    str->len += len;
    return PVIP_TRUE;
}